

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerator.cpp
# Opt level: O1

Event * __thiscall SignalGenerator::update(SignalGenerator *this,double n_dt)

{
  SignalGenerator_param *pSVar1;
  Event *pEVar2;
  Clock *this_00;
  double dVar3;
  double dVar4;
  result_type rVar5;
  double dVar6;
  _func_int **value;
  
  dVar4 = this->param->f1;
  dVar6 = 0.0;
  if (0.0 < dVar4) {
    dVar6 = Clock::getCurrentTime(this->clock);
    dVar6 = sin(dVar6 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + 0.0;
  }
  dVar4 = this->param->f2;
  if (0.0 < dVar4) {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar3 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + dVar4;
  }
  dVar4 = this->param->f3;
  if (0.0 < dVar4) {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar3 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + dVar4;
  }
  dVar4 = this->param->f4;
  if (0.0 < dVar4) {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar3 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + dVar4;
  }
  dVar4 = this->param->f5;
  if (0.0 < dVar4) {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar3 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + dVar4;
  }
  dVar4 = this->param->f6;
  if (0.0 < dVar4) {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar3 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + dVar4;
  }
  dVar4 = this->param->f7;
  if (0.0 < dVar4) {
    dVar3 = Clock::getCurrentTime(this->clock);
    dVar4 = sin(dVar3 * dVar4 * 6.2831853071794);
    dVar6 = dVar6 + dVar4;
  }
  pSVar1 = this->param;
  value = (_func_int **)(dVar6 * pSVar1->scale + pSVar1->offset);
  if (0.0 < pSVar1->noiseStd) {
    rVar5 = std::normal_distribution<double>::operator()
                      (&this->distribution,&this->generator,&(this->distribution)._M_param);
    value = (_func_int **)((double)value + rVar5);
  }
  Logging::logValue((this->super_Neuron).logger,999,0,3,(double)value);
  pEVar2 = (Event *)operator_new(0x20);
  pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_00123bc8;
  pEVar2[1]._vptr_Event = (_func_int **)0x0;
  pEVar2->type = Value;
  this_00 = Clock::getInstance();
  dVar4 = Clock::getCurrentTime(this_00);
  pEVar2->eventTime = dVar4;
  pEVar2[1]._vptr_Event = value;
  return pEVar2;
}

Assistant:

Event* SignalGenerator::update(double n_dt) {
    double signalValue = 0;
    if(param->f1 > 0)
        signalValue += sin(2*3.1415926535897*param->f1*clock->getCurrentTime());
    if(param->f2 > 0)
        signalValue += sin(2*3.1415926535897*param->f2*clock->getCurrentTime());
    if(param->f3 > 0)
        signalValue += sin(2*3.1415926535897*param->f3*clock->getCurrentTime());
    if(param->f4 > 0)
        signalValue += sin(2*3.1415926535897*param->f4*clock->getCurrentTime());
    if(param->f5 > 0)
        signalValue += sin(2*3.1415926535897*param->f5*clock->getCurrentTime());
    if(param->f6 > 0)
        signalValue += sin(2*3.1415926535897*param->f6*clock->getCurrentTime());
    if(param->f7 > 0)
        signalValue += sin(2*3.1415926535897*param->f7*clock->getCurrentTime());
    signalValue *= param->scale;
    signalValue += param->offset;
    if(param->noiseStd > 0) {
        signalValue += distribution(generator);
    }  
    logger->logValue(999, 0, EventType::Value, signalValue);
    return new ValueEvent(signalValue);
}